

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_test.cpp
# Opt level: O3

void __thiscall Buffer_testCreateBuffer_Test::TestBody(Buffer_testCreateBuffer_Test *this)

{
  ostream *poVar1;
  size_t sVar2;
  size_t sVar3;
  int i;
  long lVar4;
  string w;
  vector<char,_std::allocator<char>_> foo;
  string s;
  char data [65535];
  long *plStack_100a8;
  long lStack_100a0;
  long alStack_10098 [2];
  long *plStack_10088;
  size_t sStack_10080;
  long alStack_10078 [2];
  void *pvStack_10068;
  undefined8 uStack_10060;
  long lStack_10058;
  long *plStack_10048;
  size_t sStack_10040;
  long alStack_10038 [2];
  char acStack_10028 [65536];
  
  lVar4 = 0;
  do {
    plStack_10048 = (long *)CONCAT71(plStack_10048._1_7_,acStack_10028[lVar4]);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)&plStack_10048,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  plStack_10048 = alStack_10038;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_10048,"hello","");
  sVar3 = sStack_10040;
  memcpy(acStack_10028,plStack_10048,sStack_10040);
  plStack_10088 = alStack_10078;
  sVar2 = strlen(acStack_10028);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&plStack_10088,acStack_10028,acStack_10028 + sVar2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)plStack_10088,sStack_10080);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (plStack_10088 != alStack_10078) {
    operator_delete(plStack_10088,alStack_10078[0] + 1);
  }
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  plStack_10088 = alStack_10078;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_10088," world","");
  memcpy(acStack_10028 + sVar3,plStack_10088,sStack_10080);
  plStack_100a8 = alStack_10098;
  sVar3 = strlen(acStack_10028);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&plStack_100a8,acStack_10028,acStack_10028 + sVar3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)plStack_100a8,lStack_100a0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (plStack_100a8 != alStack_10098) {
    operator_delete(plStack_100a8,alStack_10098[0] + 1);
  }
  memset(acStack_10028,0,0xffff);
  plStack_100a8 = alStack_10098;
  sVar3 = strlen(acStack_10028);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&plStack_100a8,acStack_10028,acStack_10028 + sVar3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)plStack_100a8,lStack_100a0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (plStack_100a8 != alStack_10098) {
    operator_delete(plStack_100a8,alStack_10098[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  pvStack_10068 = (void *)0x0;
  uStack_10060 = 0;
  lStack_10058 = 0;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
            ((char *)plStack_10048,(char *)((long)plStack_10048 + sStack_10040),
             (vector<char,_std::allocator<char>_> *)&pvStack_10068);
  plStack_100a8 = alStack_10098;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)&plStack_100a8,pvStack_10068,uStack_10060);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)plStack_100a8,lStack_100a0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (plStack_100a8 != alStack_10098) {
    operator_delete(plStack_100a8,alStack_10098[0] + 1);
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
            ((char *)plStack_10088,(char *)((long)plStack_10088 + sStack_10080),
             (vector<char,_std::allocator<char>_> *)&pvStack_10068);
  plStack_100a8 = alStack_10098;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)&plStack_100a8,pvStack_10068,uStack_10060);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)plStack_100a8,lStack_100a0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (plStack_100a8 != alStack_10098) {
    operator_delete(plStack_100a8,alStack_10098[0] + 1);
  }
  if (pvStack_10068 != (void *)0x0) {
    operator_delete(pvStack_10068,lStack_10058 - (long)pvStack_10068);
  }
  if (plStack_10088 != alStack_10078) {
    operator_delete(plStack_10088,alStack_10078[0] + 1);
  }
  if (plStack_10048 != alStack_10038) {
    operator_delete(plStack_10048,alStack_10038[0] + 1);
  }
  return;
}

Assistant:

TEST(Buffer, testCreateBuffer) {
    char data[65535];
    for (int i=0; i<5; i++) {
        std::cout << data[i] << std::endl;
    };
    std::string s("hello");
    memcpy(&data, s.c_str(), s.size());
    auto offset = s.size();
    std::cout << std::string(data) << std::endl;
    std::cout << sizeof(data) << std::endl;
    std::cout << s.size() << std::endl;

    std::string w(" world");
    memcpy(&data[offset], w.c_str(), w.size());
    std::cout << std::string(data) << std::endl;
    memset(data, 0, 65535);
    std::cout << std::string(data) << std::endl;
    std::cout << "done" << std::endl;

    std::vector<char> foo;
    std::copy(s.begin(), s.end(), std::back_inserter(foo));

    std::cout << std::string(foo.begin(), foo.end()) << std::endl;

    std::copy(w.begin(), w.end(), std::back_inserter(foo));
    std::cout << std::string(foo.begin(), foo.end()) << std::endl;

}